

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTransaction::AddTxIn
          (AbstractTransaction *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tx;
  uint32_t sequence_00;
  uint32_t utxo_index;
  bool bVar1;
  uchar *puVar2;
  size_type sVar3;
  uchar *script;
  size_type script_len;
  string *message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffeb0;
  allocator *paVar4;
  wally_tx *in_stack_fffffffffffffec0;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  ByteData local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_data;
  int ret;
  ByteData local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *txid_buf;
  wally_tx *tx_pointer;
  Script *unlocking_script_local;
  uint32_t sequence_local;
  uint32_t index_local;
  Txid *txid_local;
  AbstractTransaction *this_local;
  
  txid_buf = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this->wally_tx_pointer_;
  tx_pointer = (wally_tx *)unlocking_script;
  unlocking_script_local._0_4_ = sequence;
  unlocking_script_local._4_4_ = index;
  _sequence_local = txid;
  txid_local = (Txid *)this;
  Txid::GetData(&local_68,txid);
  ByteData::GetBytes(&local_50,&local_68);
  ByteData::~ByteData((ByteData *)0x4303d8);
  local_38 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50;
  bVar1 = Script::IsEmpty((Script *)tx_pointer);
  tx = txid_buf;
  if (bVar1) {
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_38);
    sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
    script_data._0_4_ =
         wally_tx_add_raw_input
                   ((wally_tx *)tx,puVar2,sVar3,unlocking_script_local._4_4_,
                    (uint32_t)unlocking_script_local,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,0)
    ;
  }
  else {
    Script::GetData(&local_b0,(Script *)tx_pointer);
    ByteData::GetBytes(&local_98,&local_b0);
    ByteData::~ByteData((ByteData *)0x4304d3);
    local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98;
    in_stack_fffffffffffffec0 = (wally_tx *)txid_buf;
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_38);
    sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
    utxo_index = unlocking_script_local._4_4_;
    sequence_00 = (uint32_t)unlocking_script_local;
    script = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_80);
    script_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_80);
    script_data._0_4_ =
         wally_tx_add_raw_input
                   (in_stack_fffffffffffffec0,puVar2,sVar3,utxo_index,sequence_00,script,script_len,
                    (wally_tx_witness_stack *)0x0,0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffeb0)
    ;
  }
  if ((int)script_data != 0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x16f;
    local_c8.funcname = "AddTxIn";
    logger::warn<int&>(&local_c8,"wally_tx_add_raw_input NG[{}].",(int *)&script_data);
    message = (string *)__cxa_allocate_exception(0x30);
    paVar4 = &local_e9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e8,"txin add error.",paVar4);
    CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffec0,(CfdError)((ulong)paVar4 >> 0x20),message);
    __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void AbstractTransaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &txid_buf = txid.GetData().GetBytes();
  int ret;
  if (unlocking_script.IsEmpty()) {
    ret = wally_tx_add_raw_input(
        tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence, NULL, 0,
        NULL, 0);
  } else {
    const std::vector<uint8_t> &script_data =
        unlocking_script.GetData().GetBytes();
    ret = wally_tx_add_raw_input(
        tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence,
        script_data.data(), script_data.size(), NULL, 0);
  }
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_raw_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }
}